

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

char * nifti_units_string(int uu)

{
  if (uu < 0x18) {
    switch(uu) {
    case 1:
      return "m";
    case 2:
      return "mm";
    case 3:
      return "um";
    case 4:
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      return "s";
    default:
      if (uu == 0x10) {
        return "ms";
      }
    }
  }
  else if (uu < 0x28) {
    if (uu == 0x18) {
      return "us";
    }
    if (uu == 0x20) {
      return "Hz";
    }
  }
  else {
    if (uu == 0x28) {
      return "ppm";
    }
    if (uu == 0x30) {
      return "rad/s";
    }
  }
  return "Unknown";
}

Assistant:

char const *nifti_units_string( int uu )
{
   switch( uu ){
     case NIFTI_UNITS_METER:  return "m" ;
     case NIFTI_UNITS_MM:     return "mm" ;
     case NIFTI_UNITS_MICRON: return "um" ;
     case NIFTI_UNITS_SEC:    return "s" ;
     case NIFTI_UNITS_MSEC:   return "ms" ;
     case NIFTI_UNITS_USEC:   return "us" ;
     case NIFTI_UNITS_HZ:     return "Hz" ;
     case NIFTI_UNITS_PPM:    return "ppm" ;
     case NIFTI_UNITS_RADS:   return "rad/s" ;
   }
   return "Unknown" ;
}